

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_gpio_clr_multi(uint32_t mask)

{
  bcm2835_peri_write(bcm2835_gpio + 10,mask);
  return;
}

Assistant:

void bcm2835_gpio_clr_multi(uint32_t mask)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPCLR0/4;
    bcm2835_peri_write(paddr, mask);
}